

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O0

bool __thiscall cmSetPropertyCommand::HandleCacheEntry(cmSetPropertyCommand *this,string *cacheKey)

{
  cmState *this_00;
  cmState *__s;
  char *propertyName;
  string *key;
  allocator<char> local_89;
  string local_88;
  allocator<char> local_51;
  string local_50;
  cmState *local_30;
  cmState *state;
  char *value;
  string *name;
  string *cacheKey_local;
  cmSetPropertyCommand *this_local;
  
  value = (char *)&this->PropertyName;
  name = cacheKey;
  cacheKey_local = (string *)this;
  state = (cmState *)std::__cxx11::string::c_str();
  local_30 = cmMakefile::GetState((this->super_cmCommand).Makefile);
  if ((this->Remove & 1U) != 0) {
    cmState::RemoveCacheEntryProperty(local_30,name,(string *)value);
  }
  key = name;
  propertyName = value;
  __s = state;
  this_00 = local_30;
  if ((this->AppendMode & 1U) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,(char *)__s,&local_89);
    cmState::SetCacheEntryProperty(this_00,key,(string *)propertyName,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator(&local_89);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,(char *)__s,&local_51);
    cmState::AppendCacheEntryProperty
              (this_00,key,(string *)propertyName,&local_50,(bool)(this->AppendAsString & 1));
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
  }
  return true;
}

Assistant:

bool cmSetPropertyCommand::HandleCacheEntry(std::string const& cacheKey)
{
  // Set or append the property.
  std::string const& name = this->PropertyName;
  const char* value = this->PropertyValue.c_str();
  cmState* state = this->Makefile->GetState();
  if (this->Remove) {
    state->RemoveCacheEntryProperty(cacheKey, name);
  }
  if (this->AppendMode) {
    state->AppendCacheEntryProperty(cacheKey, name, value,
                                    this->AppendAsString);
  } else {
    state->SetCacheEntryProperty(cacheKey, name, value);
  }

  return true;
}